

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_leaf.cpp
# Opt level: O2

void duckdb::BaseLeaf<(unsigned_char)'\a',_(duckdb::NType)8>::InsertByteInternal
               (BaseLeaf<(unsigned_char)__a_,_(duckdb::NType)8> *n,uint8_t byte)

{
  byte bVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  bVar1 = n->count;
  uVar4 = (ulong)bVar1;
  for (uVar2 = 0; (uVar3 = uVar4, uVar4 != uVar2 && (uVar3 = uVar2, n->key[uVar2] < byte));
      uVar2 = uVar2 + 1) {
  }
  for (; uVar3 < uVar4; uVar4 = uVar4 - 1) {
    n->key[uVar4] = n->key[(int)uVar4 - 1];
  }
  n->key[uVar3] = byte;
  n->count = bVar1 + 1;
  return;
}

Assistant:

void BaseLeaf<CAPACITY, TYPE>::InsertByteInternal(BaseLeaf &n, const uint8_t byte) {
	// Still space. Insert the child.
	uint8_t child_pos = 0;
	while (child_pos < n.count && n.key[child_pos] < byte) {
		child_pos++;
	}

	// Move children backwards to make space.
	for (uint8_t i = n.count; i > child_pos; i--) {
		n.key[i] = n.key[i - 1];
	}

	n.key[child_pos] = byte;
	n.count++;
}